

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int cuddEstimateCofactorSimple(DdNode *node,int i)

{
  int iVar1;
  int eval;
  int tval;
  int i_local;
  DdNode *node_local;
  
  if (((ulong)node->next & 1) == 0) {
    node->next = (DdNode *)((ulong)node->next ^ 1);
    if (node->index == 0x7fffffff) {
      node_local._4_4_ = 1;
    }
    else {
      node_local._4_4_ = cuddEstimateCofactorSimple((node->type).kids.T,i);
      if (node->index != i) {
        iVar1 = cuddEstimateCofactorSimple
                          ((DdNode *)((ulong)(node->type).kids.E & 0xfffffffffffffffe),i);
        node_local._4_4_ = node_local._4_4_ + 1 + iVar1;
      }
    }
  }
  else {
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

static int
cuddEstimateCofactorSimple(
  DdNode * node,
  int i)
{
    int tval, eval;

    if (Cudd_IsComplement(node->next)) {
        return(0);
    }
    node->next = Cudd_Not(node->next);
    if (cuddIsConstant(node)) {
        return(1);
    }
    tval = cuddEstimateCofactorSimple(cuddT(node),i);
    if ((int) node->index == i) return(tval);
    eval = cuddEstimateCofactorSimple(Cudd_Regular(cuddE(node)),i);
    return(1 + tval + eval);

}